

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O1

void __thiscall DCFGReader::readImages(DCFGReader *this,json *array)

{
  bool bVar1;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar2;
  reference pbVar3;
  reference pvVar4;
  Addr baseAddr;
  int iVar5;
  int ret;
  iterator it2;
  iterator ed;
  iterator it;
  iterator local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_78;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_58;
  iterator *piVar6;
  
  local_58.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_58.m_object = (pointer)0x0;
  local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_78.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_78.m_object = (pointer)0x0;
  local_78.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_78.m_it.primitive_iterator.m_it = -0x8000000000000000;
  if (array->m_type != array) {
    __assert_fail("array.is_array()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0xd9,"void DCFGReader::readImages(json &)");
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)&local_98,array);
  piVar2 = nlohmann::detail::
           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&local_98);
  local_58.m_object = piVar2->m_object;
  local_58.m_it.primitive_iterator.m_it = (piVar2->m_it).primitive_iterator.m_it;
  local_58.m_it.object_iterator._M_node = (piVar2->m_it).object_iterator._M_node;
  local_58.m_it.array_iterator._M_current = (piVar2->m_it).array_iterator._M_current;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_b8,array);
  local_78.m_it.object_iterator._M_node = local_b8.m_it.object_iterator._M_node;
  local_78.m_it.array_iterator._M_current = local_b8.m_it.array_iterator._M_current;
  local_78.m_it.primitive_iterator.m_it = local_b8.m_it.primitive_iterator.m_it;
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_58,&local_78);
  if (!bVar1) {
    do {
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*(&local_58);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pbVar3,1);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_98,pvVar4);
      baseAddr = str2addr(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*(&local_58);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pbVar3,3);
      if (pvVar4->m_type != object) {
        __assert_fail("idata.is_object()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                      ,0xdf,"void DCFGReader::readImages(json &)");
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[13]>((iterator *)&local_98,pvVar4,(char (*) [13])"FILE_NAME_ID");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&local_b8,pvVar4);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_98,&local_b8);
      if (bVar1) {
        __assert_fail("it2 != idata.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                      ,0xe2,"void DCFGReader::readImages(json &)");
      }
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_98);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pbVar3,(int *)&local_b8);
      iVar5 = (int)local_b8.m_object;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[13]>(&local_b8,pvVar4,(char (*) [13])"BASIC_BLOCKS");
      local_98.field_2._8_8_ = local_b8.m_it.primitive_iterator.m_it;
      local_98._M_string_length = (size_type)local_b8.m_it.object_iterator._M_node;
      local_98.field_2._M_allocated_capacity = (size_type)local_b8.m_it.array_iterator._M_current;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&local_b8,pvVar4);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_98,&local_b8);
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_98);
        readBasicBlocks(this,baseAddr,pbVar3);
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[9]>(&local_b8,pvVar4,(char (*) [9])"ROUTINES");
      local_98.field_2._8_8_ = local_b8.m_it.primitive_iterator.m_it;
      local_98._M_string_length = (size_type)local_b8.m_it.object_iterator._M_node;
      local_98.field_2._M_allocated_capacity = (size_type)local_b8.m_it.array_iterator._M_current;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&local_b8,pvVar4);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_98,&local_b8);
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_98);
        readRoutines(this,pbVar3);
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[8]>(&local_b8,pvVar4,(char (*) [8])"SYMBOLS");
      local_98.field_2._8_8_ = local_b8.m_it.primitive_iterator.m_it;
      local_98._M_string_length = (size_type)local_b8.m_it.object_iterator._M_node;
      local_98.field_2._M_allocated_capacity = (size_type)local_b8.m_it.array_iterator._M_current;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&local_b8,pvVar4);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_98,&local_b8);
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_98);
        readSymbols(this,iVar5,baseAddr,pbVar3);
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[12]>(&local_b8,pvVar4,(char (*) [12])"SOURCE_DATA");
      local_98._M_dataplus._M_p = (pointer)CONCAT44(local_b8.m_object._4_4_,(int)local_b8.m_object);
      local_98.field_2._8_8_ = local_b8.m_it.primitive_iterator.m_it;
      local_98._M_string_length = (size_type)local_b8.m_it.object_iterator._M_node;
      local_98.field_2._M_allocated_capacity = (size_type)local_b8.m_it.array_iterator._M_current;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&local_b8,pvVar4);
      piVar6 = &local_b8;
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_98,&local_b8);
      iVar5 = (int)piVar6;
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_98);
        readSourceData(this,iVar5,baseAddr,pbVar3);
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_58);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_58,&local_78);
    } while (!bVar1);
  }
  return;
}

Assistant:

void DCFGReader::readImages(json& array) {
	json::iterator it, ed;

	assert(array.is_array());

	for (it = ++(array.begin()), ed = array.end(); it != ed; ++it) {
		Addr baseAddr = str2addr((*it).at(1));

		json& idata = (*it).at(3);
		assert(idata.is_object());

		json::iterator it2 = idata.find("FILE_NAME_ID");
		assert(it2 != idata.end());
		int file_id = it2.value();

		it2 = idata.find("BASIC_BLOCKS");
		if (it2 != idata.end())
			readBasicBlocks(baseAddr, it2.value());

		it2 = idata.find("ROUTINES");
		if (it2 != idata.end())
			readRoutines(it2.value());

		it2 = idata.find("SYMBOLS");
		if (it2 != idata.end())
			readSymbols(file_id, baseAddr, it2.value());

		it2 = idata.find("SOURCE_DATA");
		if (it2 != idata.end())
			readSourceData(file_id, baseAddr, it2.value());
	}
}